

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::slotUndoMove(Fifteen *this)

{
  pointer this_00;
  QFlags<QMessageBox::StandardButton> local_80 [4];
  QString local_70;
  QString local_58;
  __tuple_element_t<2UL,_tuple<Move,_unsigned_long,_unsigned_long>_> *local_40;
  type_conflict2 *col;
  type_conflict2 *row;
  type *move;
  Fifteen *local_10;
  Fifteen *this_local;
  
  local_10 = this;
  this_00 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                      (&this->controller);
  Controller::undoMove((tuple<Move,_unsigned_long,_unsigned_long> *)&move,this_00);
  row = (type_conflict2 *)
        std::get<0ul,Move,unsigned_long,unsigned_long>
                  ((tuple<Move,_unsigned_long,_unsigned_long> *)&move);
  col = std::get<1ul,Move,unsigned_long,unsigned_long>
                  ((tuple<Move,_unsigned_long,_unsigned_long> *)&move);
  local_40 = std::get<2ul,Move,unsigned_long,unsigned_long>
                       ((tuple<Move,_unsigned_long,_unsigned_long> *)&move);
  if ((int)*row == 4) {
    QString::QString(&local_58,"");
    QString::QString(&local_70,"There are no moves\t");
    QFlags<QMessageBox::StandardButton>::QFlags(local_80,FirstButton);
    QMessageBox::information
              ((QWidget *)this,(QString *)&local_58,(QString *)&local_70,
               (QFlags_conflict *)(ulong)(uint)local_80[0].i,NoButton);
    QString::~QString(&local_70);
    QString::~QString(&local_58);
  }
  else {
    makeMove(this,(Move)*row,*col,*local_40);
  }
  return;
}

Assistant:

void Fifteen::slotUndoMove()
{
    auto [ move, row, col ] = controller->undoMove();
    if ( move == Move::NOT_ALLOWED )
    {
        QMessageBox::information( this, "", "There are no moves\t" );
        return;
    }

    makeMove( move, row, col );
}